

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

int DecodeImageData(VP8LDecoder *dec,uint32_t *data,int width,int height,int last_row,
                   ProcessRowsFunc process_func)

{
  VP8LBitReader *br;
  VP8LColorCache *src;
  VP8LMetadata *hdr;
  VP8LColorCache *dst;
  uint *puVar1;
  uint uVar2;
  vp8l_val_t vVar3;
  uint8_t *puVar4;
  size_t sVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  VP8LColorCache *pVVar14;
  uint *puVar15;
  uint *__dest;
  ulong uVar16;
  ulong *__src;
  long lVar17;
  uint *puVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  bool bVar23;
  HTreeGroup *local_b8;
  int local_98;
  
  iVar21 = dec->last_pixel;
  uVar12 = (long)iVar21 / (long)width;
  uVar19 = (long)iVar21 % (long)width;
  uVar22 = uVar12 & 0xffffffff;
  uVar16 = uVar19 & 0xffffffff;
  iVar10 = (dec->hdr).color_cache_size;
  iVar13 = (int)uVar12;
  local_98 = 0x1000000;
  if (dec->incremental != 0) {
    local_98 = iVar13;
  }
  src = &(dec->hdr).color_cache;
  local_b8 = (HTreeGroup *)0x0;
  pVVar14 = (VP8LColorCache *)0x0;
  if (0 < iVar10) {
    pVVar14 = src;
  }
  hdr = &dec->hdr;
  uVar2 = (dec->hdr).huffman_mask;
  if (iVar21 < last_row * width) {
    local_b8 = GetHtreeGroupForPos(hdr,(int)uVar19,iVar13);
  }
  br = &dec->br;
  __dest = data + iVar21;
  puVar1 = data + last_row * width;
  dst = &(dec->hdr).saved_color_cache;
  puVar18 = __dest;
  while (iVar21 = (int)uVar22, __dest < puVar1) {
    if (local_98 <= iVar21) {
      iVar13 = (dec->br).eos;
      (dec->saved_br).bit_pos = (dec->br).bit_pos;
      (dec->saved_br).eos = iVar13;
      vVar3 = br->val;
      puVar4 = (dec->br).buf;
      sVar5 = (dec->br).pos;
      (dec->saved_br).len = (dec->br).len;
      (dec->saved_br).pos = sVar5;
      (dec->saved_br).val = vVar3;
      (dec->saved_br).buf = puVar4;
      dec->saved_last_pixel = (int)((ulong)((long)__dest - (long)data) >> 2);
      if (0 < (dec->hdr).color_cache_size) {
        VP8LColorCacheCopy(src,dst);
      }
      local_98 = iVar21 + 8;
    }
    uVar20 = (uint)uVar16;
    if ((uVar2 & uVar20) == 0) {
      local_b8 = GetHtreeGroupForPos(hdr,uVar20,iVar21);
    }
    if (local_b8->is_trivial_code != 0) {
      uVar6 = local_b8->literal_arb;
      goto LAB_001096f1;
    }
    VP8LFillBitWindow(br);
    if (local_b8->use_packed_table == 0) {
      uVar6 = ReadSymbol(local_b8->htrees[0],br);
      uVar12 = (ulong)uVar6;
LAB_001093d5:
      iVar13 = VP8LIsEndOfStream(br);
      if (iVar13 != 0) break;
      uVar6 = (uint)uVar12;
      if ((int)uVar6 < 0x100) {
        if (local_b8->is_trivial_literal == 0) {
          iVar13 = ReadSymbol(local_b8->htrees[1],br);
          VP8LFillBitWindow(br);
          uVar8 = ReadSymbol(local_b8->htrees[2],br);
          iVar7 = ReadSymbol(local_b8->htrees[3],br);
          iVar9 = VP8LIsEndOfStream(br);
          if (iVar9 != 0) break;
          uVar6 = uVar6 << 8 | iVar13 << 0x10 | uVar8 | iVar7 << 0x18;
        }
        else {
          uVar6 = uVar6 << 8 | local_b8->literal_arb;
        }
LAB_001096f1:
        *__dest = uVar6;
        goto LAB_001096f8;
      }
      if (0x117 < uVar6) {
        if ((int)uVar6 < iVar10 + 0x118) {
          for (; puVar18 < __dest; puVar18 = puVar18 + 1) {
            pVVar14->colors[(int)(*puVar18 * 0x1e35a7bd >> ((byte)pVVar14->hash_shift & 0x1f))] =
                 *puVar18;
          }
          uVar6 = pVVar14->colors[uVar12 - 0x118];
          goto LAB_001096f1;
        }
        goto LAB_00109852;
      }
      uVar6 = GetCopyDistance(uVar6 - 0x100,br);
      iVar13 = ReadSymbol(local_b8->htrees[4],br);
      VP8LFillBitWindow(br);
      iVar13 = GetCopyDistance(iVar13,br);
      iVar13 = PlaneCodeToDistance(width,iVar13);
      iVar7 = VP8LIsEndOfStream(br);
      if (iVar7 != 0) break;
      lVar11 = (long)iVar13;
      if (((long)__dest - (long)data >> 2 < lVar11) ||
         (lVar17 = (long)(int)uVar6,
         (long)data + ((long)(height * width) * 4 - (long)__dest) >> 2 < lVar17)) goto LAB_00109852;
      __src = (ulong *)(__dest + -lVar11);
      if ((((ulong)__dest & 3) == 0) && ((3 < (int)uVar6 && (iVar13 < 3)))) {
        if (iVar13 == 1) {
          uVar8 = (uint)*__src;
          uVar12 = CONCAT44(uVar8,uVar8);
          uVar19 = (ulong)uVar8;
        }
        else {
          uVar12 = *__src;
          uVar19 = uVar12;
        }
        puVar15 = __dest;
        uVar8 = uVar6;
        if (((ulong)__dest & 4) != 0) {
          __src = (ulong *)((long)__src + 4);
          *__dest = (uint)uVar19;
          uVar12 = uVar12 << 0x20 | uVar12 >> 0x20;
          puVar15 = __dest + 1;
          uVar8 = uVar6 - 1;
        }
        for (uVar19 = 0; uVar8 >> 1 != uVar19; uVar19 = uVar19 + 1) {
          *(ulong *)(puVar15 + uVar19 * 2) = uVar12;
        }
        if ((uVar8 & 1) != 0) {
          puVar15[(int)(uVar8 & 0xfffffffe)] =
               *(uint *)((long)__src + (long)(int)(uVar8 & 0xfffffffe) * 4);
        }
      }
      else if (iVar13 < (int)uVar6) {
        uVar12 = 0;
        puVar15 = __dest;
        if (0 < (int)uVar6) {
          uVar12 = (ulong)uVar6;
        }
        while (bVar23 = uVar12 != 0, uVar12 = uVar12 - 1, bVar23) {
          *puVar15 = puVar15[-lVar11];
          puVar15 = puVar15 + 1;
        }
      }
      else {
        memcpy(__dest,__src,lVar17 * 4);
      }
      uVar20 = uVar20 + uVar6;
      while( true ) {
        uVar16 = (ulong)uVar20;
        iVar21 = (int)uVar22;
        if ((int)uVar20 < width) break;
        uVar6 = iVar21 + 1;
        if ((uVar6 & 0xf) == 0 && (iVar21 < last_row && process_func != (ProcessRowsFunc)0x0)) {
          (*process_func)(dec,uVar6);
        }
        uVar22 = (ulong)uVar6;
        uVar20 = uVar20 - width;
      }
      if ((uVar2 & uVar20) != 0) {
        local_b8 = GetHtreeGroupForPos(hdr,uVar20,iVar21);
      }
      __dest = __dest + lVar17;
      if (0 < iVar10) {
        for (; puVar18 < __dest; puVar18 = puVar18 + 1) {
          pVVar14->colors[(int)(*puVar18 * 0x1e35a7bd >> ((byte)pVVar14->hash_shift & 0x1f))] =
               *puVar18;
        }
      }
    }
    else {
      iVar13 = (dec->br).bit_pos;
      uVar6 = (uint)((dec->br).val >> ((byte)iVar13 & 0x3f)) & 0x3f;
      iVar7 = local_b8->packed_table[uVar6].bits;
      uVar6 = local_b8->packed_table[uVar6].value;
      uVar12 = (ulong)uVar6;
      iVar13 = iVar13 + iVar7;
      if (iVar7 < 0x100) {
        (dec->br).bit_pos = iVar13;
        *__dest = uVar6;
        uVar12 = 0;
      }
      else {
        (dec->br).bit_pos = iVar13 + -0x100;
      }
      iVar13 = VP8LIsEndOfStream(br);
      if (iVar13 != 0) break;
      if ((int)uVar12 != 0) goto LAB_001093d5;
LAB_001096f8:
      __dest = __dest + 1;
      uVar16 = (ulong)(uVar20 + 1);
      if (width <= (int)(uVar20 + 1)) {
        uVar20 = iVar21 + 1;
        if ((uVar20 & 0xf) == 0 && (iVar21 < last_row && process_func != (ProcessRowsFunc)0x0)) {
          (*process_func)(dec,uVar20);
        }
        uVar16 = 0;
        uVar22 = (ulong)uVar20;
        if (0 < iVar10) {
          for (; puVar18 < __dest; puVar18 = puVar18 + 1) {
            pVVar14->colors[(int)(*puVar18 * 0x1e35a7bd >> ((byte)pVVar14->hash_shift & 0x1f))] =
                 *puVar18;
          }
          uVar22 = (ulong)uVar20;
        }
      }
    }
  }
  iVar10 = VP8LIsEndOfStream(br);
  (dec->br).eos = iVar10;
  if (((__dest < puVar1) && (dec->incremental != 0)) && (iVar10 != 0)) {
    dec->status = VP8_STATUS_SUSPENDED;
    iVar21 = (dec->saved_br).eos;
    (dec->br).bit_pos = (dec->saved_br).bit_pos;
    (dec->br).eos = iVar21;
    vVar3 = (dec->saved_br).val;
    puVar4 = (dec->saved_br).buf;
    sVar5 = (dec->saved_br).pos;
    (dec->br).len = (dec->saved_br).len;
    (dec->br).pos = sVar5;
    br->val = vVar3;
    (dec->br).buf = puVar4;
    dec->last_pixel = dec->saved_last_pixel;
    iVar21 = 1;
    if (0 < (dec->hdr).color_cache_size) {
      VP8LColorCacheCopy(dst,src);
    }
  }
  else if ((__dest < puVar1 || dec->incremental == 0) && iVar10 != 0) {
LAB_00109852:
    iVar21 = 0;
    if ((dec->status == VP8_STATUS_SUSPENDED) || (dec->status == VP8_STATUS_OK)) {
      dec->status = VP8_STATUS_BITSTREAM_ERROR;
    }
  }
  else {
    if (process_func != (ProcessRowsFunc)0x0) {
      if (iVar21 < last_row) {
        last_row = iVar21;
      }
      (*process_func)(dec,last_row);
    }
    dec->status = VP8_STATUS_OK;
    dec->last_pixel = (int)((ulong)((long)__dest - (long)data) >> 2);
    iVar21 = 1;
  }
  return iVar21;
}

Assistant:

static int DecodeImageData(VP8LDecoder* const dec, uint32_t* const data,
                           int width, int height, int last_row,
                           ProcessRowsFunc process_func) {
  int row = dec->last_pixel / width;
  int col = dec->last_pixel % width;
  VP8LBitReader* const br = &dec->br;
  VP8LMetadata* const hdr = &dec->hdr;
  uint32_t* src = data + dec->last_pixel;
  uint32_t* last_cached = src;
  uint32_t* const src_end = data + width * height;     // End of data
  uint32_t* const src_last = data + width * last_row;  // Last pixel to decode
  const int len_code_limit = NUM_LITERAL_CODES + NUM_LENGTH_CODES;
  const int color_cache_limit = len_code_limit + hdr->color_cache_size;
  int next_sync_row = dec->incremental ? row : 1 << 24;
  VP8LColorCache* const color_cache =
      (hdr->color_cache_size > 0) ? &hdr->color_cache : NULL;
  const int mask = hdr->huffman_mask;
  const HTreeGroup* htree_group =
      (src < src_last) ? GetHtreeGroupForPos(hdr, col, row) : NULL;
  assert(dec->last_row < last_row);
  assert(src_last <= src_end);

  while (src < src_last) {
    int code;
    if (row >= next_sync_row) {
      SaveState(dec, (int)(src - data));
      next_sync_row = row + SYNC_EVERY_N_ROWS;
    }
    // Only update when changing tile. Note we could use this test:
    // if "((((prev_col ^ col) | prev_row ^ row)) > mask)" -> tile changed
    // but that's actually slower and needs storing the previous col/row.
    if ((col & mask) == 0) {
      htree_group = GetHtreeGroupForPos(hdr, col, row);
    }
    assert(htree_group != NULL);
    if (htree_group->is_trivial_code) {
      *src = htree_group->literal_arb;
      goto AdvanceByOne;
    }
    VP8LFillBitWindow(br);
    if (htree_group->use_packed_table) {
      code = ReadPackedSymbols(htree_group, br, src);
      if (VP8LIsEndOfStream(br)) break;
      if (code == PACKED_NON_LITERAL_CODE) goto AdvanceByOne;
    } else {
      code = ReadSymbol(htree_group->htrees[GREEN], br);
    }
    if (VP8LIsEndOfStream(br)) break;
    if (code < NUM_LITERAL_CODES) {  // Literal
      if (htree_group->is_trivial_literal) {
        *src = htree_group->literal_arb | (code << 8);
      } else {
        int red, blue, alpha;
        red = ReadSymbol(htree_group->htrees[RED], br);
        VP8LFillBitWindow(br);
        blue = ReadSymbol(htree_group->htrees[BLUE], br);
        alpha = ReadSymbol(htree_group->htrees[ALPHA], br);
        if (VP8LIsEndOfStream(br)) break;
        *src = ((uint32_t)alpha << 24) | (red << 16) | (code << 8) | blue;
      }
    AdvanceByOne:
      ++src;
      ++col;
      if (col >= width) {
        col = 0;
        ++row;
        if (process_func != NULL) {
          if (row <= last_row && (row % NUM_ARGB_CACHE_ROWS == 0)) {
            process_func(dec, row);
          }
        }
        if (color_cache != NULL) {
          while (last_cached < src) {
            VP8LColorCacheInsert(color_cache, *last_cached++);
          }
        }
      }
    } else if (code < len_code_limit) {  // Backward reference
      int dist_code, dist;
      const int length_sym = code - NUM_LITERAL_CODES;
      const int length = GetCopyLength(length_sym, br);
      const int dist_symbol = ReadSymbol(htree_group->htrees[DIST], br);
      VP8LFillBitWindow(br);
      dist_code = GetCopyDistance(dist_symbol, br);
      dist = PlaneCodeToDistance(width, dist_code);

      if (VP8LIsEndOfStream(br)) break;
      if (src - data < (ptrdiff_t)dist || src_end - src < (ptrdiff_t)length) {
        goto Error;
      } else {
        CopyBlock32b(src, dist, length);
      }
      src += length;
      col += length;
      while (col >= width) {
        col -= width;
        ++row;
        if (process_func != NULL) {
          if (row <= last_row && (row % NUM_ARGB_CACHE_ROWS == 0)) {
            process_func(dec, row);
          }
        }
      }
      // Because of the check done above (before 'src' was incremented by
      // 'length'), the following holds true.
      assert(src <= src_end);
      if (col & mask) htree_group = GetHtreeGroupForPos(hdr, col, row);
      if (color_cache != NULL) {
        while (last_cached < src) {
          VP8LColorCacheInsert(color_cache, *last_cached++);
        }
      }
    } else if (code < color_cache_limit) {  // Color cache
      const int key = code - len_code_limit;
      assert(color_cache != NULL);
      while (last_cached < src) {
        VP8LColorCacheInsert(color_cache, *last_cached++);
      }
      *src = VP8LColorCacheLookup(color_cache, key);
      goto AdvanceByOne;
    } else {  // Not reached
      goto Error;
    }
  }

  br->eos = VP8LIsEndOfStream(br);
  // In incremental decoding:
  // br->eos && src < src_last: if 'br' reached the end of the buffer and
  // 'src_last' has not been reached yet, there is not enough data. 'dec' has to
  // be reset until there is more data.
  // !br->eos && src < src_last: this cannot happen as either the buffer is
  // fully read, either enough has been read to reach 'src_last'.
  // src >= src_last: 'src_last' is reached, all is fine. 'src' can actually go
  // beyond 'src_last' in case the image is cropped and an LZ77 goes further.
  // The buffer might have been enough or there is some left. 'br->eos' does
  // not matter.
  assert(!dec->incremental || (br->eos && src < src_last) || src >= src_last);
  if (dec->incremental && br->eos && src < src_last) {
    RestoreState(dec);
  } else if ((dec->incremental && src >= src_last) || !br->eos) {
    // Process the remaining rows corresponding to last row-block.
    if (process_func != NULL) {
      process_func(dec, row > last_row ? last_row : row);
    }
    dec->status = VP8_STATUS_OK;
    dec->last_pixel = (int)(src - data);  // end-of-scan marker
  } else {
    // if not incremental, and we are past the end of buffer (eos=1), then this
    // is a real bitstream error.
    goto Error;
  }
  return 1;

 Error:
  return VP8LSetError(dec, VP8_STATUS_BITSTREAM_ERROR);
}